

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QString * __thiscall QCommandLineParser::value(QCommandLineParser *this,QString *optionName)

{
  long lVar1;
  bool bVar2;
  QList<QString> *in_RSI;
  QCommandLineParserPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *unaff_retaddr;
  QCommandLineParser *in_stack_00000008;
  QStringList valueList;
  QCommandLineParserPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QCommandLineParserPrivate::checkParsed(in_RDI,(char *)0x6f27ea);
  values(in_stack_00000008,unaff_retaddr);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x6f282c);
  if (bVar2) {
    QString::QString((QString *)0x6f2859);
  }
  else {
    QList<QString>::last(in_RSI);
    QString::QString(&this_00->errorText,&in_RDI->errorText);
  }
  QList<QString>::~QList((QList<QString> *)0x6f286b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this_00->errorText;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::value(const QString &optionName) const
{
    d->checkParsed("value");
    const QStringList valueList = values(optionName);

    if (!valueList.isEmpty())
        return valueList.last();

    return QString();
}